

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListView.cpp
# Opt level: O2

QList<QColor> * __thiscall
QColorListView::selectedColors(QList<QColor> *__return_storage_ptr__,QColorListView *this)

{
  QForeachContainer<QList<QModelIndex>_> _container_102;
  QModelIndexList indexes;
  QForeachContainer<QList<QModelIndex>_> local_b0;
  QArrayDataPointer<QModelIndex> local_80;
  QArrayDataPointer<char16_t> local_68;
  QVariant local_50;
  QColor local_30;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::selectedRows((int)&local_80);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QColor *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QtPrivate::QForeachContainer<QList<QModelIndex>_>::QForeachContainer
            (&local_b0,(QList<QModelIndex> *)&local_80);
  for (; local_b0.i.i != local_b0.e.i; local_b0.i.i = local_b0.i.i + 1) {
    QModelIndex::data(&local_50,local_b0.i.i,0x100);
    QVariant::toString();
    QColor::setNamedColor((QString *)&local_30);
    QList<QColor>::emplaceBack<QColor>(__return_storage_ptr__,&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QVariant::~QVariant(&local_50);
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_b0);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_80);
  return __return_storage_ptr__;
}

Assistant:

QList<QColor> QColorListView::selectedColors() const {
    const QModelIndexList indexes = selectionModel()->selectedRows();
    QList<QColor> colors;

    foreach (const QModelIndex &index, indexes) {
        colors << QColor(index.data(static_cast<int>(QColorListModel::Role::HexArgbName)).toString());
    }

    return colors;
}